

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::changeEvent(QMdiSubWindow *this,QEvent *changeEvent)

{
  QFlagsStorage<Qt::WindowState> QVar1;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar2;
  Representation RVar3;
  Representation RVar4;
  Representation RVar5;
  char cVar6;
  QFlagsStorage<Qt::WindowState> QVar7;
  long in_FS_OFFSET;
  QFlagsStorageHelper<Qt::WindowState,_4> local_50;
  QFlagsStorage<Qt::WindowState> local_4c;
  void *local_48;
  QFlagsStorage<Qt::WindowState> *pQStack_40;
  QFlagsStorageHelper<Qt::WindowState,_4> *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) == 0) ||
     (*(short *)(changeEvent + 8) != 0x69)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QWidget::changeEvent(&this->super_QWidget,changeEvent);
      return;
    }
    goto LAB_00459086;
  }
  cVar6 = QWindowStateChangeEvent::isOverride();
  if (cVar6 == '\0') {
    QVar1.i = *(Int *)(changeEvent + 0x10);
    QVar7.i = (Int)QWidget::windowState(&this->super_QWidget);
    if (QVar1.i == QVar7.i) goto LAB_00458f18;
    this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
    if ((((this->super_QWidget).data)->widget_attributes & 0x8000) == 0) {
      QMdiSubWindowPrivate::ensureWindowState(this_00,WindowNoState);
      (**(code **)(*(long *)&this->super_QWidget + 0x68))(this,1);
    }
    if (((this_00->oldGeometry).x2.m_i < (this_00->oldGeometry).x1.m_i) ||
       ((this_00->oldGeometry).y2.m_i < (this_00->oldGeometry).y1.m_i)) {
      pQVar2 = (this->super_QWidget).data;
      RVar3.m_i = (pQVar2->crect).y1.m_i;
      RVar4.m_i = (pQVar2->crect).x2.m_i;
      RVar5.m_i = (pQVar2->crect).y2.m_i;
      (this_00->oldGeometry).x1 = (Representation)(pQVar2->crect).x1.m_i;
      (this_00->oldGeometry).y1 = (Representation)RVar3.m_i;
      (this_00->oldGeometry).x2 = (Representation)RVar4.m_i;
      (this_00->oldGeometry).y2 = (Representation)RVar5.m_i;
    }
    if ((QVar7.i & QVar1.i & 8) != 0) {
      this_00->currentOperation = None;
    }
    if ((QVar7.i & 1) == 0 || (QVar1.i & 1) != 0) {
      if ((QVar7.i & 2) == 0 || (char)((QVar1.i & 2) >> 1) != '\0') {
        if ((QVar7.i & 7) == 0) {
          QMdiSubWindowPrivate::setNormalMode(this_00);
        }
      }
      else {
        QMdiSubWindowPrivate::setMaximizeMode(this_00);
      }
    }
    else {
      QMdiSubWindowPrivate::setMinimizeMode(this_00);
    }
    if (this_00->isActive == true) {
      QMdiSubWindowPrivate::ensureWindowState(this_00,WindowActive);
    }
    if (this_00->activationEnabled == true) {
      local_50.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)QWidget::windowState(&this->super_QWidget);
      pQStack_40 = &local_4c;
      local_38 = &local_50;
      local_48 = (void *)0x0;
      local_4c.i = QVar1.i;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
    }
  }
  else {
LAB_00458f18:
    changeEvent[0xc] = (QEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00459086:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::changeEvent(QEvent *changeEvent)
{
    if (!parent()) {
        QWidget::changeEvent(changeEvent);
        return;
    }

    if (changeEvent->type() != QEvent::WindowStateChange) {
        QWidget::changeEvent(changeEvent);
        return;
    }

    QWindowStateChangeEvent *event = static_cast<QWindowStateChangeEvent *>(changeEvent);
    if (event->isOverride()) {
        event->ignore();
        return;
    }

    Qt::WindowStates oldState = event->oldState();
    Qt::WindowStates newState = windowState();
    if (oldState == newState) {
        changeEvent->ignore();
        return;
    }

    // QWidget ensures that the widget is visible _after_ setWindowState(),
    // but we need to ensure that the widget is visible _before_
    // setWindowState() returns.
    Q_D(QMdiSubWindow);
    if (!isVisible()) {
        d->ensureWindowState(Qt::WindowNoState);
        setVisible(true);
    }

    if (!d->oldGeometry.isValid())
        d->oldGeometry = geometry();

    if ((oldState & Qt::WindowActive) && (newState & Qt::WindowActive))
        d->currentOperation = QMdiSubWindowPrivate::None;

    if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized))
        d->setMinimizeMode();
    else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized))
        d->setMaximizeMode();
    else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized | Qt::WindowFullScreen)))
        d->setNormalMode();

    if (d->isActive)
        d->ensureWindowState(Qt::WindowActive);
    if (d->activationEnabled)
        emit windowStateChanged(oldState, windowState());
}